

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O0

void ClipperLib::CleanPolygons(Paths *in_polys,Paths *out_polys,double distance)

{
  size_type sVar1;
  const_reference in_poly;
  reference out_poly;
  undefined8 local_28;
  size_type i;
  double distance_local;
  Paths *out_polys_local;
  Paths *in_polys_local;
  
  sVar1 = std::
          vector<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
          ::size(in_polys);
  std::
  vector<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
  ::resize(out_polys,sVar1);
  local_28 = 0;
  while( true ) {
    sVar1 = std::
            vector<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
            ::size(in_polys);
    if (sVar1 <= local_28) break;
    in_poly = std::
              vector<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
              ::operator[](in_polys,local_28);
    out_poly = std::
               vector<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
               ::operator[](out_polys,local_28);
    CleanPolygon(in_poly,out_poly,distance);
    local_28 = local_28 + 1;
  }
  return;
}

Assistant:

void CleanPolygons(const Paths& in_polys, Paths& out_polys, double distance)
{
  out_polys.resize(in_polys.size());
  for (Paths::size_type i = 0; i < in_polys.size(); ++i)
    CleanPolygon(in_polys[i], out_polys[i], distance);
}